

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,TPZGeoBlend<pzgeom::TPZGeoPoint> *cp)

{
  long lVar1;
  bool bVar2;
  
  TPZGeoPoint::TPZGeoPoint(&this->super_TPZGeoPoint,&PTR_PTR_016c4388,&cp->super_TPZGeoPoint);
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c4330;
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_016b1180;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x30);
  bVar2 = true;
  lVar1 = 0;
  while (bVar2) {
    this->fNeighbours[lVar1].fGeoElIndex = cp->fNeighbours[lVar1].fGeoElIndex;
    this->fNeighbours[lVar1].fSide = cp->fNeighbours[lVar1].fSide;
    bVar2 = false;
    TPZTransform<double>::operator=
              ((TPZTransform<double> *)(&this->field_0x30 + lVar1 * 0x1a0),
               (TPZTransform<double> *)((long)cp->fNeighbours + lVar1 * 0x1a0 + 0x18));
    lVar1 = 1;
  }
  this->fGeoEl = (TPZGeoEl *)0x0;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x3f);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp) : TPZRegisterClassId(&TPZGeoBlend::ClassId), TGeo(cp) {
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is] =  cp.fNeighbours[is];
                fTrans[is] =  cp.fTrans[is];
            }
            fGeoEl = 0;
            DebugStop();
        }